

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxvfmt.cpp
# Opt level: O0

uint32 rw::xbox::getVertexFmtStride(uint32 fmt)

{
  uint uVar1;
  int local_2c;
  int local_28;
  int local_24;
  int local_1c;
  uint32 t;
  int i;
  uint32 n;
  uint32 v;
  uint32 stride;
  uint32 fmt_local;
  
  uVar1 = fmt >> 4 & 0xf;
  if ((fmt & 0xf) == 4) {
    local_24 = 4;
  }
  else {
    local_24 = *(int *)(vertexFormatSizes + (ulong)(fmt & 0xf) * 4) * 3;
  }
  if (uVar1 == 4) {
    local_28 = 4;
  }
  else {
    local_28 = *(int *)(vertexFormatSizes + (ulong)uVar1 * 4) * 3;
  }
  n = local_28 + local_24;
  if ((fmt & 0x1000000) != 0) {
    n = n + 4;
  }
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    uVar1 = fmt >> ((char)(local_1c << 2) + 8U & 0x1f) & 0xf;
    if (uVar1 == 4) {
      local_2c = 4;
    }
    else {
      local_2c = *(int *)(vertexFormatSizes + (ulong)uVar1 * 4) << 1;
    }
    n = local_2c + n;
  }
  if ((fmt & 0xe000000) != 0) {
    n = n + 8;
  }
  return n;
}

Assistant:

uint32
getVertexFmtStride(uint32 fmt)
{
	uint32 stride = 0;
	uint32 v = fmt & 0xF;
	uint32 n = (fmt >> 4) & 0xF;
	stride += v == 4 ? 4 : 3*vertexFormatSizes[v];
	stride += n == 4 ? 4 : 3*vertexFormatSizes[n];
	if(fmt & 0x1000000)
		stride += 4;
	for(int i = 0; i < 4; i++){
		uint32 t = (fmt >> (i*4 + 8)) & 0xF;
		stride += t == 4 ? 4 : 2*vertexFormatSizes[t];
	}
	if(fmt & 0xE000000)
		stride += 8;
	return stride;
}